

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O0

bool __thiscall OpenMD::Ellipsoid::isInterior(Ellipsoid *this,Vector3d *pos)

{
  double *pdVar1;
  Vector<double,_3U> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  bool result;
  RealType zovera;
  RealType yoverb;
  RealType xoverb;
  Vector3d rbody;
  Vector3d r;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  Vector<double,_3U> *in_stack_ffffffffffffff78;
  Vector<double,_3U> *in_stack_ffffffffffffff90;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffff98;
  Vector<double,_3U> local_58 [3];
  
  OpenMD::operator-(in_stack_ffffffffffffff78,
                    (Vector<double,_3U> *)
                    CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  Vector3<double>::Vector3
            ((Vector3<double> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_RDI
            );
  OpenMD::operator*(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Vector3<double>::Vector3
            ((Vector3<double> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_RDI
            );
  pdVar1 = Vector<double,_3U>::operator[](local_58,0);
  dVar2 = *pdVar1 / in_RDI[3].data_[0];
  pdVar1 = Vector<double,_3U>::operator[](local_58,1);
  dVar3 = *pdVar1 / in_RDI[3].data_[0];
  pdVar1 = Vector<double,_3U>::operator[](local_58,2);
  dVar4 = *pdVar1 / in_RDI[2].data_[2];
  return dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3 < 1.0;
}

Assistant:

bool Ellipsoid::isInterior(Vector3d pos) {
    Vector3d r     = pos - origin_;
    Vector3d rbody = rotMat_ * r;

    RealType xoverb = rbody[0] / rEquatorial_;
    RealType yoverb = rbody[1] / rEquatorial_;
    RealType zovera = rbody[2] / rAxial_;

    bool result;
    if (xoverb * xoverb + yoverb * yoverb + zovera * zovera < 1)
      result = true;
    else
      result = false;

    return result;
  }